

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

bool __thiscall cmCTestBuildHandler::IsLaunchedErrorFile(cmCTestBuildHandler *this,char *fname)

{
  bool bVar1;
  size_t sVar2;
  string_view str;
  string_view str_00;
  
  sVar2 = strlen(fname);
  str._M_str = fname;
  str._M_len = sVar2;
  bVar1 = cmHasLiteralPrefix<7ul>(str,(char (*) [7])"error-");
  if (bVar1) {
    sVar2 = strlen(fname);
    str_00._M_str = fname;
    str_00._M_len = sVar2;
    bVar1 = cmHasLiteralSuffix<5ul>(str_00,(char (*) [5])0x600bab);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmCTestBuildHandler::IsLaunchedErrorFile(const char* fname)
{
  // error-{hash}.xml
  return (cmHasLiteralPrefix(fname, "error-") &&
          cmHasLiteralSuffix(fname, ".xml"));
}